

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_hostop(compiler_state_t *cstate,bpf_u_int32 addr,bpf_u_int32 mask,int dir,int proto,
                  u_int src_off,u_int dst_off)

{
  block *pbVar1;
  block *pbVar2;
  
  switch(dir) {
  case 0:
  case 3:
    pbVar1 = gen_hostop(cstate,addr,mask,1,proto,src_off,dst_off);
    pbVar2 = gen_hostop(cstate,addr,mask,2,proto,src_off,dst_off);
    gen_or(pbVar1,pbVar2);
    return pbVar2;
  case 1:
    dst_off = src_off;
  case 2:
    pbVar1 = gen_linktype(cstate,proto);
    pbVar2 = gen_ncmp(cstate,OR_LINKPL,dst_off,0,mask,0x10,0,addr);
    break;
  case 4:
    pbVar1 = gen_hostop(cstate,addr,mask,1,proto,src_off,dst_off);
    pbVar2 = gen_hostop(cstate,addr,mask,2,proto,src_off,dst_off);
    break;
  default:
    abort();
  }
  gen_and(pbVar1,pbVar2);
  return pbVar2;
}

Assistant:

static struct block *
gen_hostop(compiler_state_t *cstate, bpf_u_int32 addr, bpf_u_int32 mask,
    int dir, int proto, u_int src_off, u_int dst_off)
{
	struct block *b0, *b1;
	u_int offset;

	switch (dir) {

	case Q_SRC:
		offset = src_off;
		break;

	case Q_DST:
		offset = dst_off;
		break;

	case Q_AND:
		b0 = gen_hostop(cstate, addr, mask, Q_SRC, proto, src_off, dst_off);
		b1 = gen_hostop(cstate, addr, mask, Q_DST, proto, src_off, dst_off);
		gen_and(b0, b1);
		return b1;

	case Q_OR:
	case Q_DEFAULT:
		b0 = gen_hostop(cstate, addr, mask, Q_SRC, proto, src_off, dst_off);
		b1 = gen_hostop(cstate, addr, mask, Q_DST, proto, src_off, dst_off);
		gen_or(b0, b1);
		return b1;

	default:
		abort();
	}
	b0 = gen_linktype(cstate, proto);
	b1 = gen_mcmp(cstate, OR_LINKPL, offset, BPF_W, (bpf_int32)addr, mask);
	gen_and(b0, b1);
	return b1;
}